

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::~Reader(Reader *this)

{
  int in_ESI;
  Builder *in_RDI;
  array<RawToken,_3UL> *in_stack_fffffffffffffff0;
  
  zstr::ifstream::close((ifstream *)in_RDI,in_ESI);
  Builder::~Builder(in_RDI);
  std::
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  ::~map((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          *)0x42139c);
  std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>::~vector
            ((vector<ProcessedToken,_std::allocator<ProcessedToken>_> *)in_stack_fffffffffffffff0);
  std::array<RawToken,_3UL>::~array(in_stack_fffffffffffffff0);
  std::__cxx11::string::~string((string *)&in_RDI[5].variables._M_h._M_rehash_policy._M_next_resize)
  ;
  zstr::ifstream::~ifstream((ifstream *)in_RDI);
  return;
}

Assistant:

~Reader() { file.close(); }